

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

void __thiscall
estl::vector_s<Rect,_6UL>::vector_s(vector_s<Rect,_6UL> *this,initializer_list<Rect> *init)

{
  pointer pvVar1;
  uint uVar2;
  const_iterator last;
  size_type sVar3;
  pointer insert_ptr;
  size_type i;
  size_type diff;
  const_iterator end;
  const_iterator it;
  initializer_list<Rect> *init_local;
  vector_s<Rect,_6UL> *this_local;
  
  this->size_ = 0;
  this->data_ptr_ = (pointer)this->data_;
  end = std::initializer_list<Rect>::begin(init);
  last = std::initializer_list<Rect>::end(init);
  sVar3 = vector_s<Rect,6ul>::check_range<Rect_const*>((vector_s<Rect,6ul> *)this,end,last);
  insert_ptr = (pointer)0x0;
  for (; end != last; end = end + 1) {
    pvVar1 = this->data_ptr_;
    uVar2 = end->height_;
    pvVar1[(long)insert_ptr].width_ = end->width_;
    pvVar1[(long)insert_ptr].height_ = uVar2;
    insert_ptr = (pointer)((long)&insert_ptr->width_ + 1);
  }
  this->size_ = sVar3;
  return;
}

Assistant:

vector_s(const std::initializer_list<T>& init)
    {
    //        std::cout << "vector_s(const std::initializer_list<T>& init) constructor this: " << this <<  std::endl;
        auto it = init.begin();
        const auto end = init.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
    }